

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenconv.h
# Opt level: O2

vector<float,_std::allocator<float>_> *
makeVectorsFromEigen
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,VectorXf *vecvalues)

{
  size_type __n;
  CoeffReturnType pfVar1;
  size_t i;
  size_type index;
  allocator_type local_21;
  
  __n = (vecvalues->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,__n,&local_21);
  for (index = 0; __n != index; index = index + 1) {
    pfVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)vecvalues,index
                       );
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start[index] = *pfVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<float> makeVectorsFromEigen(const VectorXf &vecvalues)
{
    using std::vector;
    size_t n = vecvalues.size();
    vector<float> b(n);
    for (size_t i = 0; i < n; ++i)
    {
        b[i] = vecvalues(i);
    }
    return b;
}